

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O2

void __thiscall jpge::jpeg_encoder::load_mcu(jpeg_encoder *this,void *pSrc)

{
  byte bVar1;
  byte bVar2;
  uint8 uVar3;
  uint8 uVar4;
  uint8 uVar5;
  byte bVar6;
  int iVar7;
  uint8 *puVar8;
  long lVar9;
  uint8 *puVar10;
  uint uVar11;
  int iVar12;
  bool bVar13;
  
  puVar8 = this->m_mcu_lines[this->m_mcu_y_ofs];
  iVar12 = this->m_image_bpp;
  iVar7 = this->m_image_x;
  if (this->m_num_components == '\x01') {
    if (iVar12 == 4) {
      for (lVar9 = 0; iVar7 != (int)lVar9; lVar9 = lVar9 + 1) {
        puVar8[lVar9] =
             (uint8)((uint)*(byte *)((long)pSrc + lVar9 * 4 + 2) * 0x1d2f +
                     (uint)*(byte *)((long)pSrc + lVar9 * 4 + 1) * 0x9646 +
                     (uint)*(byte *)((long)pSrc + lVar9 * 4) * 0x4c8b + 0x8000 >> 0x10);
      }
    }
    else if (iVar12 == 3) {
      for (lVar9 = 0; iVar7 != (int)lVar9; lVar9 = lVar9 + 1) {
        puVar8[lVar9] =
             (uint8)((uint)*(byte *)((long)pSrc + 2) * 0x1d2f +
                     (uint)*(byte *)((long)pSrc + 1) * 0x9646 + (uint)*pSrc * 0x4c8b + 0x8000 >>
                    0x10);
        pSrc = (void *)((long)pSrc + 3);
      }
    }
    else {
      memcpy(puVar8,pSrc,(long)iVar7);
    }
  }
  else if (iVar12 == 4) {
    puVar10 = puVar8;
    for (lVar9 = 0; iVar7 != (int)lVar9; lVar9 = lVar9 + 1) {
      bVar6 = *(byte *)((long)pSrc + lVar9 * 4);
      bVar1 = *(byte *)((long)pSrc + lVar9 * 4 + 1);
      bVar2 = *(byte *)((long)pSrc + lVar9 * 4 + 2);
      *puVar10 = (uint8)((uint)bVar2 * 0x1d2f + 0x8000 + (uint)bVar1 * 0x9646 + (uint)bVar6 * 0x4c8b
                        >> 0x10);
      uVar11 = ((int)((uint)bVar2 * 0x8000 + 0x8000 + (uint)bVar1 * -0x54cd + (uint)bVar6 * -0x2b33)
               >> 0x10) + 0x80;
      if (0xfe < uVar11) {
        uVar11 = 0xff;
      }
      puVar10[1] = (uint8)uVar11;
      uVar11 = ((int)((uint)bVar2 * -0x14d1 + 0x8000 + (uint)bVar1 * -0x6b2f + (uint)bVar6 * 0x8000)
               >> 0x10) + 0x80;
      if (0xfe < uVar11) {
        uVar11 = 0xff;
      }
      puVar10[2] = (uint8)uVar11;
      puVar10 = puVar10 + 3;
    }
  }
  else if (iVar12 == 3) {
    lVar9 = 0;
    while (bVar13 = iVar7 != 0, iVar7 = iVar7 + -1, bVar13) {
      bVar6 = *(byte *)((long)pSrc + lVar9);
      bVar1 = *(byte *)((long)pSrc + lVar9 + 1);
      bVar2 = *(byte *)((long)pSrc + lVar9 + 2);
      puVar8[lVar9] =
           (uint8)((uint)bVar2 * 0x1d2f + 0x8000 + (uint)bVar1 * 0x9646 + (uint)bVar6 * 0x4c8b >>
                  0x10);
      uVar11 = ((int)((uint)bVar2 * 0x8000 + 0x8000 + (uint)bVar1 * -0x54cd + (uint)bVar6 * -0x2b33)
               >> 0x10) + 0x80;
      if (0xfe < uVar11) {
        uVar11 = 0xff;
      }
      puVar8[lVar9 + 1] = (uint8)uVar11;
      uVar11 = ((int)((uint)bVar2 * -0x14d1 + 0x8000 + (uint)bVar1 * -0x6b2f + (uint)bVar6 * 0x8000)
               >> 0x10) + 0x80;
      if (0xfe < uVar11) {
        uVar11 = 0xff;
      }
      puVar8[lVar9 + 2] = (uint8)uVar11;
      lVar9 = lVar9 + 3;
    }
  }
  else {
    puVar10 = puVar8;
    for (lVar9 = 0; iVar7 != (int)lVar9; lVar9 = lVar9 + 1) {
      *puVar10 = *(uint8 *)((long)pSrc + lVar9);
      puVar10[1] = 0x80;
      puVar10[2] = 0x80;
      puVar10 = puVar10 + 3;
    }
  }
  if (this->m_num_components == '\x01') {
    memset(this->m_mcu_lines[this->m_mcu_y_ofs] + this->m_image_bpl_xlt,
           (uint)puVar8[(long)this->m_image_bpl_xlt + -1],
           (long)this->m_image_x_mcu - (long)this->m_image_x);
  }
  else {
    lVar9 = (long)this->m_image_bpl_xlt;
    uVar3 = puVar8[lVar9 + -3];
    uVar4 = puVar8[lVar9 + -2];
    uVar5 = puVar8[lVar9 + -1];
    puVar8 = this->m_mcu_lines[this->m_mcu_y_ofs] + lVar9;
    for (iVar12 = this->m_image_x; iVar12 < this->m_image_x_mcu; iVar12 = iVar12 + 1) {
      *puVar8 = uVar3;
      puVar8[1] = uVar4;
      puVar8[2] = uVar5;
      puVar8 = puVar8 + 3;
    }
  }
  bVar6 = this->m_mcu_y_ofs + 1;
  this->m_mcu_y_ofs = bVar6;
  if (this->m_mcu_y == (uint)bVar6) {
    process_mcu_row(this);
    this->m_mcu_y_ofs = '\0';
  }
  return;
}

Assistant:

void jpeg_encoder::load_mcu(const void *pSrc)
{
  const uint8* Psrc = reinterpret_cast<const uint8*>(pSrc);

  uint8* pDst = m_mcu_lines[m_mcu_y_ofs]; // OK to write up to m_image_bpl_xlt bytes to pDst

  if (m_num_components == 1)
  {
    if (m_image_bpp == 4)
      RGBA_to_Y(pDst, Psrc, m_image_x);
    else if (m_image_bpp == 3)
      RGB_to_Y(pDst, Psrc, m_image_x);
    else
      memcpy(pDst, Psrc, m_image_x);
  }
  else
  {
    if (m_image_bpp == 4)
      RGBA_to_YCC(pDst, Psrc, m_image_x);
    else if (m_image_bpp == 3)
      RGB_to_YCC(pDst, Psrc, m_image_x);
    else
      Y_to_YCC(pDst, Psrc, m_image_x);
  }

  // Possibly duplicate pixels at end of scanline if not a multiple of 8 or 16
  if (m_num_components == 1)
    memset(m_mcu_lines[m_mcu_y_ofs] + m_image_bpl_xlt, pDst[m_image_bpl_xlt - 1], m_image_x_mcu - m_image_x);
  else
  {
    const uint8 y = pDst[m_image_bpl_xlt - 3 + 0], cb = pDst[m_image_bpl_xlt - 3 + 1], cr = pDst[m_image_bpl_xlt - 3 + 2];
    uint8 *q = m_mcu_lines[m_mcu_y_ofs] + m_image_bpl_xlt;
    for (int i = m_image_x; i < m_image_x_mcu; i++)
    {
      *q++ = y; *q++ = cb; *q++ = cr;
    }
  }

  if (++m_mcu_y_ofs == m_mcu_y)
  {
    process_mcu_row();
    m_mcu_y_ofs = 0;
  }
}